

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  CommandOptions Options;
  FileReaderFactory defaultFactory;
  Result_t result;
  char *local_f8;
  CommandOptions local_98 [2];
  
  Kumu::Result_t::Result_t(&result,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.version_flag == true) {
    banner(_stdout);
  }
  if (Options.help_flag == true) {
    usage(_stdout);
  }
  iVar1 = 0;
  if ((Options.version_flag == false) && (Options.help_flag == false)) {
    if (Options.error_flag == true) {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n","as-02-info");
      iVar1 = 3;
    }
    else {
      init_rate_info();
      while (Options.filenames.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&Options.filenames
            ) {
        if (_result < 0) goto LAB_0010b9a1;
        show_file_info(local_98,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_98);
        Kumu::Result_t::~Result_t((Result_t *)local_98);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&Options.filenames);
      }
      iVar1 = 0;
      if (_result < 0) {
LAB_0010b9a1:
        fputs("Program stopped on error.\n",_stderr);
        iVar1 = 1;
        if (_result != Kumu::RESULT_FAIL) {
          fputs(local_f8,_stderr);
          fputc(10,_stderr);
        }
      }
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&Options.filenames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  Kumu::Result_t::~Result_t(&result);
  return iVar1;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  init_rate_info();
  Kumu::FileReaderFactory defaultFactory;
  while ( ! Options.filenames.empty() && ASDCP_SUCCESS(result) )
    {
      result = show_file_info(Options, defaultFactory);
      Options.filenames.pop_front();
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}